

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::Trim(ON_LineCurve *this,ON_Interval *domain)

{
  bool bVar1;
  double dVar2;
  undefined1 local_50 [8];
  ON_3dPoint q;
  ON_3dPoint p;
  bool rc;
  ON_Interval *domain_local;
  ON_LineCurve *this_local;
  
  p.z._7_1_ = false;
  bVar1 = ON_Interval::IsIncreasing(domain);
  if ((bVar1) && (bVar1 = ON_Interval::Includes(&this->m_t,domain,false), bVar1)) {
    dVar2 = ON_Interval::operator[](domain,0);
    ON_Curve::PointAt((ON_3dPoint *)&q.z,&this->super_ON_Curve,dVar2);
    dVar2 = ON_Interval::operator[](domain,1);
    ON_Curve::PointAt((ON_3dPoint *)local_50,&this->super_ON_Curve,dVar2);
    bVar1 = ON_3dPoint::IsCoincident((ON_3dPoint *)&q.z,(ON_3dPoint *)local_50);
    p.z._7_1_ = !bVar1;
    if (p.z._7_1_) {
      (this->m_line).from.x = q.z;
      (this->m_line).from.y = p.x;
      (this->m_line).from.z = p.y;
      (this->m_line).to.x = (double)local_50;
      (this->m_line).to.y = q.x;
      (this->m_line).to.z = q.y;
      (this->m_t).m_t[0] = domain->m_t[0];
      (this->m_t).m_t[1] = domain->m_t[1];
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    }
  }
  return p.z._7_1_;
}

Assistant:

bool ON_LineCurve::Trim( const ON_Interval& domain )
{
  bool rc = false;
  if ( domain.IsIncreasing() && m_t.Includes(domain) )
  {
    ON_3dPoint p = PointAt( domain[0] );
    ON_3dPoint q = PointAt( domain[1] );
		if( !p.IsCoincident(q)){			
      // 7-May-21 GBA, A successful trim should return an IsValid ON_LineCurve .
			m_line.from = p;
			m_line.to = q;
			m_t = domain;
      DestroyCurveTree();
			rc = true;
		}
  }
  return rc;
}